

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionPropertiesThreads_Test::TestBody
          (SSLVersionTest_SessionPropertiesThreads_Test *this)

{
  pointer ptVar1;
  bool bVar2;
  size_type __n;
  pointer __result;
  thread *ptVar3;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_b278af79_for__M_head_impl *__args;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_b278af79_for__M_head_impl *__args_00;
  thread *thread;
  pointer ptVar4;
  long lVar5;
  char *in_R9;
  char *pcVar6;
  AssertionResult gtest_ar__4;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  AssertHelper local_e0;
  Message local_d8;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL> ssls [4];
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ulong local_48;
  pointer local_38;
  
  bVar2 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest);
  if (bVar2) {
    local_68._M_p = (pointer)&local_58;
    local_98._24_8_ = 0;
    local_78._8_8_ = 0;
    sStack_60 = 0;
    local_58._8_8_ = 0;
    local_98._0_8_ = (SSL_SESSION *)0x0;
    local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
    local_78._M_allocated_capacity = 0;
    local_58._M_allocated_capacity = 0;
    local_48._0_4_ = 0;
    local_48._4_1_ = false;
    local_48._5_3_ = 0;
    local_98._16_8_ = &local_78;
    CreateClientSession((anon_unknown_0 *)&threads,
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)local_98);
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    ssls[0]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl._0_1_ =
         threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_start == (pointer)0x0;
    ssls[1]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&threads);
    ClientConfig::~ClientConfig((ClientConfig *)local_98);
    if (ptVar1 == (pointer)0x0) goto LAB_0019d3c3;
    testing::Message::Message((Message *)&threads);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)ssls,
               (AssertionResult *)"CreateClientSession(client_ctx_.get(), server_ctx_.get())","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a4d,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&threads);
  }
  else {
    SSL_CTX_set_options((this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0x4000);
    SSL_CTX_set_session_cache_mode
              ((this->super_SSLVersionTest).client_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
    SSL_CTX_set_session_cache_mode
              ((this->super_SSLVersionTest).server_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
    bVar2 = SSLVersionTest::UseCertAndKey
                      (&this->super_SSLVersionTest,
                       (this->super_SSLVersionTest).client_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    ssls[0]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl._0_1_ = bVar2;
    ssls[1]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
    if (bVar2) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(ssls + 1));
      bVar2 = SSLVersionTest::UseCertAndKey
                        (&this->super_SSLVersionTest,
                         (this->super_SSLVersionTest).server_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      ssls[0]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_ = bVar2;
      ssls[1]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
      if (bVar2) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(ssls + 1));
        SSL_CTX_set_custom_verify
                  ((this->super_SSLVersionTest).client_ctx_._M_t.
                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
                   TestBody::anon_class_1_0_00000001::__invoke);
        SSL_CTX_set_custom_verify
                  ((this->super_SSLVersionTest).server_ctx_._M_t.
                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
                   TestBody::anon_class_1_0_00000001::__invoke);
        local_98._24_8_ = 0;
        local_78._8_8_ = 0;
        sStack_60 = 0;
        local_58._8_8_ = 0;
        local_98._0_8_ = (ssl_session_st *)0x0;
        local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
        local_78._M_allocated_capacity = 0;
        local_58._M_allocated_capacity = 0;
        local_48 = 0;
        local_98._16_8_ = &local_78;
        local_68._M_p = (pointer)&local_58;
        CreateClientSession((anon_unknown_0 *)&session,
                            (this->super_SSLVersionTest).client_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (this->super_SSLVersionTest).server_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (ClientConfig *)local_98);
        ClientConfig::~ClientConfig((ClientConfig *)local_98);
        ssls[1]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
        ssls[0]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_ =
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
             session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
            session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&threads);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)ssls,(AssertionResult *)0x30d804,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__4,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1a63,(char *)local_98._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__4,(Message *)&threads);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
          std::__cxx11::string::~string((string *)local_98);
          if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(ssls + 1));
          goto LAB_0019d597;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(ssls + 1));
        ssls[2]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
        ssls[3]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
        local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
        local_98._24_8_ = 0;
        ssls[0]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
        ssls[1]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
        local_78._M_allocated_capacity = local_78._M_allocated_capacity & 0xffffffffffffff00;
        sStack_60 = 0;
        local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
        local_48 = local_48 & 0xffffff0000000000;
        local_98._0_8_ =
             session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        pcVar6 = (char *)0x1;
        local_98._16_8_ = &local_78;
        local_68._M_p = (pointer)&local_58;
        gtest_ar__4.success_ =
             ConnectClientAndServer
                       (ssls,ssls + 1,
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)local_98,true);
        gtest_ar__4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (gtest_ar__4.success_) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
          pcVar6 = (char *)0x1;
          gtest_ar__4.success_ =
               ConnectClientAndServer
                         (ssls + 2,ssls + 3,
                          (this->super_SSLVersionTest).client_ctx_._M_t.
                          super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                          (this->super_SSLVersionTest).server_ctx_._M_t.
                          super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                          (ClientConfig *)local_98,true);
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar__4.success_) {
            testing::Message::Message(&local_d8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&threads,(internal *)&gtest_ar__4,
                       (AssertionResult *)
                       "ConnectClientAndServer(&ssls[2], &ssls[3], client_ctx_.get(), server_ctx_.get(), config)"
                       ,"false","true",pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1a6c,(char *)threads.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
            goto LAB_0019d520;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __args_00 = extraout_RDX;
          for (lVar5 = 0;
              ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish,
              ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_start, lVar5 != 0x20; lVar5 = lVar5 + 8) {
            gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)&((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&ssls[0]._M_t.
                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + lVar5))->
                      _M_t;
            if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                              (&threads,1,"vector::_M_realloc_insert");
              ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_start;
              local_38 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                                   ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                                    &threads,__n);
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test::TestBody()::__0>
                        ((allocator_type *)(((long)ptVar1 - (long)ptVar4) + (long)__result),
                         (thread *)&gtest_ar__4,__args);
              ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                 (ptVar4,ptVar1,__result,(allocator<std::thread> *)&threads);
              ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                 (ptVar1,local_38,ptVar3 + 1,(allocator<std::thread> *)&threads);
              std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                        ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar4,
                         (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar4 >>
                         3);
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = __result + __n;
              __args_00 = extraout_RDX_01;
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start = __result;
            }
            else {
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test::TestBody()::__0>
                        ((allocator_type *)
                         threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(thread *)&gtest_ar__4,__args_00)
              ;
              ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish + 1;
              __args_00 = extraout_RDX_00;
            }
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = ptVar3;
          }
          for (; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
            std::thread::join();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
        }
        else {
          testing::Message::Message(&local_d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&threads,(internal *)&gtest_ar__4,
                     (AssertionResult *)
                     "ConnectClientAndServer(&ssls[0], &ssls[1], client_ctx_.get(), server_ctx_.get(), config)"
                     ,"false","true",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1a6a,(char *)threads.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
LAB_0019d520:
          testing::internal::AssertHelper::~AssertHelper(&local_e0);
          std::__cxx11::string::~string((string *)&threads);
          if (local_d8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_d8.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
        }
        ClientConfig::~ClientConfig((ClientConfig *)local_98);
        lVar5 = 0x18;
        do {
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                     ((long)&ssls[0]._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + lVar5));
          lVar5 = lVar5 + -8;
        } while (lVar5 != -8);
LAB_0019d597:
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
        return;
      }
      testing::Message::Message((Message *)&threads);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)ssls,
                 (AssertionResult *)"UseCertAndKey(server_ctx_.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__4,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a56,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&threads);
    }
    else {
      testing::Message::Message((Message *)&threads);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)ssls,
                 (AssertionResult *)"UseCertAndKey(client_ctx_.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__4,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a55,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&threads);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)local_98);
  if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start)->_M_id)._M_thread + 8))();
  }
LAB_0019d3c3:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(ssls + 1));
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionPropertiesThreads) {
  if (is_tls13()) {
    // Our TLS 1.3 implementation does not support stateful resumption.
    ASSERT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));
    return;
  }

  SSL_CTX_set_options(server_ctx_.get(), SSL_OP_NO_TICKET);
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);

  ASSERT_TRUE(UseCertAndKey(client_ctx_.get()));
  ASSERT_TRUE(UseCertAndKey(server_ctx_.get()));

  // Configure mutual authentication, so we have more session state.
  SSL_CTX_set_custom_verify(
      client_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });
  SSL_CTX_set_custom_verify(
      server_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });

  // Establish a client session to test with.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);

  // Resume with it twice.
  UniquePtr<SSL> ssls[4];
  ClientConfig config;
  config.session = session.get();
  ASSERT_TRUE(ConnectClientAndServer(&ssls[0], &ssls[1], client_ctx_.get(),
                                     server_ctx_.get(), config));
  ASSERT_TRUE(ConnectClientAndServer(&ssls[2], &ssls[3], client_ctx_.get(),
                                     server_ctx_.get(), config));

  // Read properties in parallel.
  auto read_properties = [](const SSL *ssl) {
    EXPECT_TRUE(SSL_get_peer_cert_chain(ssl));
    bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(ssl));
    EXPECT_TRUE(peer);
    EXPECT_TRUE(SSL_get_current_cipher(ssl));
    EXPECT_TRUE(SSL_get_group_id(ssl));
  };

  std::vector<std::thread> threads;
  for (const auto &ssl_ptr : ssls) {
    const SSL *ssl = ssl_ptr.get();
    threads.emplace_back([=] { read_properties(ssl); });
  }
  for (auto &thread : threads) {
    thread.join();
  }
}